

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::Functional::DepthStencilCase::iterate(DepthStencilCase *this)

{
  ostringstream *poVar1;
  pointer pDVar2;
  Surface *pSVar3;
  ReferenceQuadRenderer *pRVar4;
  RenderContext *context;
  bool bVar5;
  deUint32 dVar6;
  RenderTarget *pRVar7;
  long lVar8;
  uint viewportY;
  long lVar9;
  IterateResult IVar10;
  uint uVar11;
  pointer pDVar12;
  char *pcVar13;
  RenderCommand *pRVar14;
  void *pvVar15;
  int iVar16;
  uint viewportX;
  pointer pRVar17;
  pointer pRVar18;
  int iVar19;
  byte bVar20;
  RGBA threshold;
  Surface renderedImg;
  Random rnd;
  RefRenderCommand refTestCmd;
  RGBA local_344;
  Surface local_340;
  PixelBufferAccess local_328;
  PixelBufferAccess local_300;
  PixelBufferAccess local_2d8;
  PixelBufferAccess local_2b0;
  PixelBufferAccess local_288;
  RenderCommand local_25c;
  PixelBufferAccess local_1e8;
  deRandom local_1c0;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [104];
  ios_base local_138 [40];
  FragmentOperationState local_110;
  
  bVar20 = 0;
  dVar6 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar11 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar11 = (uVar11 >> 4 ^ uVar11) * 0x27d4eb2d;
  deRandom_init(&local_1c0,uVar11 >> 0xf ^ dVar6 ^ uVar11);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar19 = pRVar7->m_width;
  iVar16 = (this->m_renderTarget).width;
  dVar6 = deRandom_getUint32(&local_1c0);
  viewportX = dVar6 % ((iVar19 - iVar16) + 1U);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar19 = pRVar7->m_height;
  iVar16 = (this->m_renderTarget).height;
  dVar6 = deRandom_getUint32(&local_1c0);
  viewportY = dVar6 % ((iVar19 - iVar16) + 1U);
  local_25c.params.visibleFace = FACETYPE_LAST;
  local_25c.params.stencilTestEnabled = false;
  local_25c.params.depthWriteMask = false;
  local_25c.params.depthFunc = 0;
  local_25c.params.depth = 0.0;
  local_25c.params.stencil[0].function = 0;
  local_25c.params.stencil[0].reference = 0;
  local_25c.params.stencil[0].compareMask = 0;
  local_25c.params.stencil[0].stencilFailOp = 0;
  local_25c.params.stencil[0].depthFailOp = 0;
  local_25c.params.stencil[0].depthPassOp = 0;
  local_25c.params.stencil[0].writeMask = 0;
  local_25c.params.stencil[1].function = 0;
  local_25c.params.stencil[1].reference = 0;
  local_25c.params.stencil[1].compareMask = 0;
  local_25c.params.stencil[1].stencilFailOp._0_1_ = 0;
  local_25c.params.stencil[1]._13_7_ = 0;
  local_25c.params.stencil[1].depthPassOp._0_1_ = 0;
  local_25c.params._57_8_ = 0;
  local_25c.rect.left = 0;
  local_25c.rect.bottom = 0;
  local_25c.rect.width = 0;
  local_25c.rect.height = 0;
  local_25c.color.m_data[0] = 0.0;
  local_25c.color.m_data[1] = 0.0;
  local_25c.color.m_data[2] = 0.0;
  local_25c.color.m_data[3] = 0.0;
  local_25c.colorMask.m_data[0] = false;
  local_25c.colorMask.m_data[1] = false;
  local_25c.colorMask.m_data[2] = false;
  local_25c.colorMask.m_data[3] = false;
  tcu::Surface::Surface(&local_340,(this->m_renderTarget).width,(this->m_renderTarget).height);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar19 = (pRVar7->m_pixelFormat).alphaBits;
  uVar11 = 0;
  if (0 < iVar19) {
    uVar11 = 0x1000000 << (8U - (char)iVar19 & 0x1f);
  }
  local_344.m_value =
       0x100 << (8U - (char)(pRVar7->m_pixelFormat).greenBits & 0x1f) |
       1 << ((byte)(8 - (char)(pRVar7->m_pixelFormat).redBits) & 0x1f) |
       0x10000 << (8U - (char)(pRVar7->m_pixelFormat).blueBits & 0x1f) | uVar11;
  local_25c.color.m_data[0] = 1.0;
  local_25c.color.m_data[1] = 0.0;
  local_25c.color.m_data[2] = 0.0;
  local_25c.color.m_data[3] = 1.0;
  local_25c.colorMask.m_data[0] = true;
  local_25c.colorMask.m_data[1] = true;
  local_25c.colorMask.m_data[2] = true;
  local_25c.colorMask.m_data[3] = true;
  local_25c.rect.width = (this->m_renderTarget).width;
  local_25c.rect.height = (this->m_renderTarget).height;
  local_25c.rect.left = 0;
  local_25c.rect.bottom = 0;
  lVar9 = (long)this->m_iterNdx;
  pDVar2 = (this->m_cases).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar12 = pDVar2 + lVar9;
  pRVar14 = &local_25c;
  for (lVar8 = 0x13; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pRVar14->params).visibleFace = pDVar12->visibleFace;
    pDVar12 = (pointer)((long)pDVar12 + ((ulong)bVar20 * -2 + 1) * 4);
    pRVar14 = (RenderCommand *)((long)pRVar14 + ((ulong)bVar20 * -2 + 1) * 4);
  }
  local_25c.params.depthWriteMask = pDVar2[lVar9].depthWriteMask;
  if (lVar9 == 0) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Channels:\n  RED: passing pixels\n  GREEN: stencil values\n  BLUE: depth values",
               0x4c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  if (1 < (ulong)(((long)(this->m_cases).
                         super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_cases).
                         super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Iteration ",10);
    std::ostream::operator<<(poVar1,this->m_iterNdx);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"...",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
  }
  DepthStencilCaseUtil::operator<<
            (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             (this->m_cases).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_iterNdx);
  DepthStencilCaseUtil::render(&this->m_baseClears,viewportX,viewportY);
  pRVar17 = (this->m_baseDepthRenders).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar17 !=
      (this->m_baseDepthRenders).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      DepthStencilCaseUtil::render(this->m_renderer,pRVar17,viewportX,viewportY);
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 !=
             (this->m_baseDepthRenders).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  DepthStencilCaseUtil::render(this->m_renderer,&local_25c,viewportX,viewportY);
  pRVar17 = (this->m_visualizeCommands).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar17 !=
      (this->m_visualizeCommands).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      DepthStencilCaseUtil::render(this->m_renderer,pRVar17,viewportX,viewportY);
      pRVar17 = pRVar17 + 1;
    } while (pRVar17 !=
             (this->m_visualizeCommands).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  glwColorMask('\x01','\x01','\x01','\x01');
  glwDepthMask('\x01');
  glwStencilMask(0xffffffff);
  glwFlush();
  local_1b0._0_4_ = R;
  local_1b0._4_4_ = SNORM_INT8;
  local_1b0._8_4_ = 1;
  local_1b0._12_4_ = 1;
  memset(local_1a0,0,0x90);
  rr::FragmentOperationState::FragmentOperationState(&local_110);
  DepthStencilCaseUtil::translateCommand
            (&local_25c,(RefRenderCommand *)local_1b0,&this->m_renderTarget);
  pSVar3 = this->m_refColorBuffer;
  local_2d8.super_ConstPixelBufferAccess.m_format.order = RGBA;
  local_2d8.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  pvVar15 = (void *)(pSVar3->m_pixels).m_cap;
  if (pvVar15 != (void *)0x0) {
    pvVar15 = (pSVar3->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_328,(TextureFormat *)&local_2d8,pSVar3->m_width,pSVar3->m_height,1,pvVar15);
  tcu::TextureLevel::getAccess(&local_2d8,this->m_refStencilBuffer);
  DepthStencilCaseUtil::renderReference
            (&this->m_baseClears,&local_328,&local_2d8,(this->m_renderTarget).stencilBits);
  pRVar18 = (this->m_refBaseDepthRenders).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar18 !=
      (this->m_refBaseDepthRenders).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pRVar4 = this->m_refRenderer;
      pSVar3 = this->m_refColorBuffer;
      local_300.super_ConstPixelBufferAccess.m_format.order = RGBA;
      local_300.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
      pvVar15 = (void *)(pSVar3->m_pixels).m_cap;
      if (pvVar15 != (void *)0x0) {
        pvVar15 = (pSVar3->m_pixels).m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_2d8,(TextureFormat *)&local_300,pSVar3->m_width,pSVar3->m_height,1,pvVar15);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2d8);
      tcu::TextureLevel::getAccess(&local_1e8,this->m_refDepthBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_300,&local_1e8);
      tcu::TextureLevel::getAccess(&local_2b0,this->m_refStencilBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_2b0);
      deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
                (pRVar4,&local_328,&local_300,&local_288,&pRVar18->quad,&pRVar18->state);
      pRVar18 = pRVar18 + 1;
    } while (pRVar18 !=
             (this->m_refBaseDepthRenders).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pRVar4 = this->m_refRenderer;
  pSVar3 = this->m_refColorBuffer;
  local_300.super_ConstPixelBufferAccess.m_format.order = RGBA;
  local_300.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  pvVar15 = (void *)(pSVar3->m_pixels).m_cap;
  if (pvVar15 != (void *)0x0) {
    pvVar15 = (pSVar3->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_2d8,(TextureFormat *)&local_300,pSVar3->m_width,pSVar3->m_height,1,pvVar15);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2d8);
  tcu::TextureLevel::getAccess(&local_1e8,this->m_refDepthBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_300,&local_1e8);
  tcu::TextureLevel::getAccess(&local_2b0,this->m_refStencilBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_2b0);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar4,&local_328,&local_300,&local_288,(IntegerQuad *)local_1b0,&local_110);
  pRVar18 = (this->m_refVisualizeCommands).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar18 !=
      (this->m_refVisualizeCommands).
      super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pRVar4 = this->m_refRenderer;
      pSVar3 = this->m_refColorBuffer;
      local_300.super_ConstPixelBufferAccess.m_format.order = RGBA;
      local_300.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
      pvVar15 = (void *)(pSVar3->m_pixels).m_cap;
      if (pvVar15 != (void *)0x0) {
        pvVar15 = (pSVar3->m_pixels).m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_2d8,(TextureFormat *)&local_300,pSVar3->m_width,pSVar3->m_height,1,pvVar15);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_328,&local_2d8);
      tcu::TextureLevel::getAccess(&local_1e8,this->m_refDepthBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_300,&local_1e8);
      tcu::TextureLevel::getAccess(&local_2b0,this->m_refStencilBuffer);
      deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_288,&local_2b0);
      deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
                (pRVar4,&local_328,&local_300,&local_288,&pRVar18->quad,&pRVar18->state);
      pRVar18 = pRVar18 + 1;
    } while (pRVar18 !=
             (this->m_refVisualizeCommands).
             super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::RefRenderCommand>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_328.super_ConstPixelBufferAccess.m_format.order = RGBA;
  local_328.super_ConstPixelBufferAccess.m_format.type = UNORM_INT8;
  if ((void *)local_340.m_pixels.m_cap != (void *)0x0) {
    local_340.m_pixels.m_cap = (size_t)local_340.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_328,local_340.m_width,
             local_340.m_height,1,(void *)local_340.m_pixels.m_cap);
  glu::readPixels(context,viewportX,viewportY,(PixelBufferAccess *)local_1b0);
  iVar19 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar19;
  pDVar2 = (this->m_cases).
           super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar12 = (this->m_cases).
            super__Vector_base<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams,_std::allocator<deqp::gles2::Functional::DepthStencilCaseUtil::DepthStencilParams>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar5 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "CompareResult","Image Comparison Result",this->m_refColorBuffer,&local_340,
                     &local_344,COMPARE_LOG_RESULT);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  pcVar13 = "  FAILED!";
  if (bVar5) {
    pcVar13 = "  Passed.";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  iVar16 = (int)((ulong)((long)pDVar2 - (long)pDVar12) >> 4);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (bVar5) {
    IVar10 = CONTINUE;
    if (SBORROW4(iVar19,iVar16 * -0x33333333) != iVar19 + iVar16 * 0x33333333 < 0)
    goto LAB_003e6881;
  }
  else {
    IVar10 = CONTINUE;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
    if (bVar5 && SBORROW4(iVar19,iVar16 * -0x33333333) != iVar19 + iVar16 * 0x33333333 < 0)
    goto LAB_003e6881;
  }
  IVar10 = STOP;
LAB_003e6881:
  tcu::Surface::~Surface(&local_340);
  return IVar10;
}

Assistant:

DepthStencilCase::IterateResult DepthStencilCase::iterate (void)
{
	de::Random				rnd				(deStringHash(getName()) ^ deInt32Hash(m_iterNdx));
	int						viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-m_renderTarget.width);
	int						viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-m_renderTarget.height);
	RenderCommand			testCmd;

	tcu::Surface			renderedImg		(m_renderTarget.width, m_renderTarget.height);
	tcu::RGBA				threshold		= m_context.getRenderTarget().getPixelFormat().getColorThreshold();

	// Fill in test command for this iteration.
	testCmd.color		= Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	testCmd.colorMask	= tcu::BVec4(true);
	testCmd.rect		= rr::WindowRectangle(0, 0, m_renderTarget.width, m_renderTarget.height);
	testCmd.params		= m_cases[m_iterNdx];

	if (m_iterNdx == 0)
	{
		m_testCtx.getLog() << TestLog::Message << "Channels:\n"
													"  RED: passing pixels\n"
													"  GREEN: stencil values\n"
													"  BLUE: depth values"
							<< TestLog::EndMessage;
	}

	if (m_cases.size() > 1)
		m_testCtx.getLog() << TestLog::Message << "Iteration " << m_iterNdx << "..." << TestLog::EndMessage;

	m_testCtx.getLog() << m_cases[m_iterNdx];

	// Submit render commands to gl GL.

	// Base clears.
	render(m_baseClears, viewportX, viewportY);

	// Base depths.
	for (vector<RenderCommand>::const_iterator cmd = m_baseDepthRenders.begin(); cmd != m_baseDepthRenders.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Test command.
	render(*m_renderer, testCmd, viewportX, viewportY);

	// Visualization commands.
	for (vector<RenderCommand>::const_iterator cmd = m_visualizeCommands.begin(); cmd != m_visualizeCommands.end(); ++cmd)
		render(*m_renderer, *cmd, viewportX, viewportY);

	// Re-enable all write masks.
	glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	glDepthMask(GL_TRUE);
	glStencilMask(~0u);

	// Ask GPU to start rendering.
	glFlush();

	// Render reference while GPU is doing work.
	{
		RefRenderCommand refTestCmd;
		translateCommand(testCmd, refTestCmd, m_renderTarget);

		// Base clears.
		renderReference(m_baseClears, m_refColorBuffer->getAccess(), m_refStencilBuffer->getAccess(), m_renderTarget.stencilBits);

		// Base depths.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refBaseDepthRenders.begin(); cmd != m_refBaseDepthRenders.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);

		// Test command.
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  refTestCmd.quad, refTestCmd.state);

		// Visualization commands.
		for (vector<RefRenderCommand>::const_iterator cmd = m_refVisualizeCommands.begin(); cmd != m_refVisualizeCommands.end(); ++cmd)
			m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
								  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
								  cmd->quad, cmd->state);
	}

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	bool	isLastIter	= m_iterNdx >= (int)m_cases.size();
	bool	compareOk	= tcu::pixelThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", *m_refColorBuffer, renderedImg, threshold,
													 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;
	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	if (compareOk && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}